

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

TValueCC calcCC<short>(TWaveformViewT<short> *waveform0,TWaveformViewT<short> *waveform1,
                      int64_t sum0,int64_t sum02)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  long in_RCX;
  long lVar5;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  double dVar6;
  double den2b;
  double den2a;
  double nom;
  int32_t a1;
  int32_t a0;
  int64_t is;
  long n;
  int64_t n1;
  short *samples1;
  int64_t n0;
  short *samples0;
  int64_t sum01;
  int64_t sum12;
  int64_t sum1;
  TValueCC cc;
  long local_70;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  undefined8 local_28;
  long local_20;
  long local_18;
  
  local_28 = 0xbff0000000000000;
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  local_48 = *in_RDI;
  local_50 = in_RDI[1];
  local_58 = *in_RSI;
  local_60 = in_RSI[1];
  local_20 = in_RCX;
  local_18 = in_RDX;
  plVar3 = std::min<long>(&local_50,&local_60);
  lVar1 = *plVar3;
  for (local_70 = 0; local_70 < lVar1; local_70 = local_70 + 1) {
    iVar2 = (int)*(short *)(local_58 + local_70 * 2);
    local_30 = iVar2 + local_30;
    local_38 = iVar2 * iVar2 + local_38;
    local_40 = *(short *)(local_48 + local_70 * 2) * iVar2 + local_40;
  }
  lVar4 = local_40 * lVar1;
  lVar5 = local_18 * local_30;
  dVar6 = sqrt((double)(local_20 * lVar1 - local_18 * local_18) *
               (double)(local_38 * lVar1 - local_30 * local_30));
  return (double)(lVar4 - lVar5) / dVar6;
}

Assistant:

TValueCC calcCC(
    const TWaveformViewT<T> & waveform0,
    const TWaveformViewT<T> & waveform1,
    int64_t sum0, int64_t sum02) {
    TValueCC cc = -1.0f;

    int64_t sum1 = 0;
    int64_t sum12 = 0;
    int64_t sum01 = 0;

    auto samples0 = waveform0.samples;
    auto n0       = waveform0.n;

    auto samples1 = waveform1.samples;
    auto n1       = waveform1.n;

#ifdef MY_DEBUG
    if (n0 != n1) {
        printf("BUG 234f8273\n");
    }
#endif
    auto n = std::min(n0, n1);

    for (int64_t is = 0; is < n; ++is) {
        int32_t a0 = samples0[is];
        int32_t a1 = samples1[is];

        sum1 += a1;
        sum12 += a1*a1;
        sum01 += a0*a1;
    }

    {
        double nom = sum01*n - sum0*sum1;
        double den2a = sum02*n - sum0*sum0;
        double den2b = sum12*n - sum1*sum1;
        cc = (nom)/(sqrt(den2a*den2b));
    }

    return cc;
}